

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# own_as_range.hpp
# Opt level: O0

iterator_range<burst::owning_iterator<std::forward_list<int,_std::allocator<int>_>_>_> * __thiscall
burst::own_as_range_t::operator()
          (iterator_range<burst::owning_iterator<std::forward_list<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,own_as_range_t *this,
          forward_list<int,_std::allocator<int>_> *container)

{
  owning_iterator<std::forward_list<int,_std::allocator<int>_>_> *in_RCX;
  owning_iterator<std::forward_list<int,_std::allocator<int>_>_> local_98;
  owning_iterator<std::forward_list<int,_std::allocator<int>_>_> local_80 [2];
  undefined1 local_50 [8];
  owning_iterator<std::forward_list<int,_std::allocator<int>_>_> end;
  owning_iterator<std::forward_list<int,_std::allocator<int>_>_> begin;
  forward_list<int,_std::allocator<int>_> *container_local;
  own_as_range_t *this_local;
  
  make_owning_iterator<std::forward_list<int,std::allocator<int>>>
            ((owning_iterator<std::forward_list<int,_std::allocator<int>_>_> *)&end.m_iterator,
             (burst *)container,container);
  make_owning_iterator<std::forward_list<int,std::allocator<int>>>
            (local_50,(burst *)&end.m_iterator);
  owning_iterator<std::forward_list<int,_std::allocator<int>_>_>::owning_iterator
            (local_80,(owning_iterator<std::forward_list<int,_std::allocator<int>_>_> *)
                      &end.m_iterator);
  owning_iterator<std::forward_list<int,_std::allocator<int>_>_>::owning_iterator
            (&local_98,(owning_iterator<std::forward_list<int,_std::allocator<int>_>_> *)local_50);
  boost::make_iterator_range<burst::owning_iterator<std::forward_list<int,std::allocator<int>>>>
            (__return_storage_ptr__,(boost *)local_80,&local_98,in_RCX);
  owning_iterator<std::forward_list<int,_std::allocator<int>_>_>::~owning_iterator(&local_98);
  owning_iterator<std::forward_list<int,_std::allocator<int>_>_>::~owning_iterator(local_80);
  owning_iterator<std::forward_list<int,_std::allocator<int>_>_>::~owning_iterator
            ((owning_iterator<std::forward_list<int,_std::allocator<int>_>_> *)local_50);
  owning_iterator<std::forward_list<int,_std::allocator<int>_>_>::~owning_iterator
            ((owning_iterator<std::forward_list<int,_std::allocator<int>_>_> *)&end.m_iterator);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container && container) const
        {
            auto begin = make_owning_iterator(std::forward<Container>(container));
            auto end = make_owning_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }